

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qvncclient.cpp
# Opt level: O1

void QVncClient::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      readClient((QVncClient *)_o);
      return;
    case 1:
      *(undefined4 *)(_o + 0x28) = 0;
      QVncServer::discardClient(*(QVncServer **)(_o + 0x10),(QVncClient *)_o);
      return;
    case 2:
      checkUpdate((QVncClient *)_o);
      return;
    case 3:
      scheduleUpdate((QVncClient *)_o);
      return;
    }
  }
  return;
}

Assistant:

void QVncClient::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QVncClient *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->readClient(); break;
        case 1: _t->discardClient(); break;
        case 2: _t->checkUpdate(); break;
        case 3: _t->scheduleUpdate(); break;
        default: ;
        }
    }
    (void)_a;
}